

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O0

ostream * operator<<(ostream *os,ResultValue value)

{
  ostream *poVar1;
  ResultValueType RVar2;
  int64_t iVar3;
  complex<double> *pcVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  undefined8 uVar6;
  complex<double> local_c8;
  complex<double> local_b8;
  complex<double> local_a8;
  complex<double> local_98;
  undefined1 local_88 [16];
  complex<double> local_78 [2];
  allocator local_51;
  string local_50 [8];
  string sign;
  complex<double> local_20;
  ostream *local_10;
  ostream *os_local;
  
  local_10 = os;
  RVar2 = ResultValue::type(&value);
  poVar1 = local_10;
  switch(RVar2) {
  case NONE:
    std::operator<<(local_10,"NONE");
    break;
  case FLOAT:
    dVar5 = ResultValue::floatValue(&value);
    std::ostream::operator<<(poVar1,dVar5);
    break;
  case INTEGER:
    iVar3 = ResultValue::intValue(&value);
    std::ostream::operator<<(poVar1,iVar3);
    break;
  case COMPLEX:
    ResultValue::complexValue(&value);
    pcVar4 = &local_20;
    std::complex<double>::imag_abi_cxx11_(pcVar4);
    std::abs((int)pcVar4);
    poVar1 = local_10;
    if (1e-10 < extraout_XMM0_Qa) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"+",&local_51);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      ResultValue::complexValue(&value);
      dVar5 = std::complex<double>::imag_abi_cxx11_(local_78);
      if (dVar5 < 0.0) {
        std::__cxx11::string::operator=(local_50,"");
      }
      ResultValue::complexValue(&value);
      local_88._8_8_ = dVar5;
      dVar5 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_88);
      poVar1 = local_10;
      uVar6 = 0;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        ResultValue::complexValue(&value);
        local_98._M_value._8_8_ = uVar6;
        dVar5 = std::complex<double>::real_abi_cxx11_(&local_98);
        std::ostream::operator<<(poVar1,dVar5);
      }
      else {
        std::__cxx11::string::operator=(local_50,"");
      }
      std::operator<<(local_10,local_50);
      ResultValue::complexValue(&value);
      pcVar4 = &local_a8;
      local_a8._M_value._8_8_ = uVar6;
      std::complex<double>::imag_abi_cxx11_(pcVar4);
      std::abs((int)pcVar4);
      poVar1 = local_10;
      uVar6 = 0x3ff0000000000000;
      if ((extraout_XMM0_Qa_00 != 1.0) || (NAN(extraout_XMM0_Qa_00))) {
        ResultValue::complexValue(&value);
        local_b8._M_value._8_8_ = uVar6;
        dVar5 = std::complex<double>::imag_abi_cxx11_(&local_b8);
        std::ostream::operator<<(poVar1,dVar5);
      }
      ResultValue::complexValue(&value);
      local_c8._M_value._8_8_ = uVar6;
      dVar5 = std::complex<double>::imag_abi_cxx11_(&local_c8);
      if ((dVar5 == -1.0) && (!NAN(dVar5))) {
        std::operator<<(local_10,"-");
      }
      std::operator<<(local_10,"i");
      std::__cxx11::string::~string(local_50);
    }
    else {
      ResultValue::complexValue(&value);
      dVar5 = std::complex<double>::real_abi_cxx11_((complex<double> *)((long)&sign.field_2 + 8));
      std::ostream::operator<<(poVar1,dVar5);
    }
  }
  return local_10;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValue value) {
	switch (value.type()) {
		case ResultValueType::NONE:
			os << "NONE";
			break;
		case ResultValueType::FLOAT:
			os << value.floatValue();
			break;
		case ResultValueType::INTEGER:
			os << value.intValue();
			break;
		case ResultValueType::COMPLEX:
			if (std::abs(value.complexValue().imag()) <= EPSILON) {
				os << value.complexValue().real();
			} else {
				std::string sign = "+";
				if (value.complexValue().imag() < 0) {
					sign = "";
				}

				if (value.complexValue().real() != 0) {
					os << value.complexValue().real();
				} else {
					sign = "";
				}

				os << sign;

				if (std::abs(value.complexValue().imag()) != 1) {
					os << value.complexValue().imag();
				}

				if (value.complexValue().imag() == -1) {
					os << "-";
				}

				os << "i";
			}
			break;
	}

	return os;
}